

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O3

unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> SuperCardPro::Open(void)

{
  pointer *__ptr;
  __uniq_ptr_data<SuperCardPro,_std::default_delete<SuperCardPro>,_true,_true> in_RDI;
  undefined8 local_10;
  
  SuperCardProUSB::Open();
  *(undefined8 *)
   in_RDI.super___uniq_ptr_impl<SuperCardPro,_std::default_delete<SuperCardPro>_>._M_t.
   super__Tuple_impl<0UL,_SuperCardPro_*,_std::default_delete<SuperCardPro>_>.
   super__Head_base<0UL,_SuperCardPro_*,_false>._M_head_impl = local_10;
  return (__uniq_ptr_data<SuperCardPro,_std::default_delete<SuperCardPro>,_true,_true>)
         (tuple<SuperCardPro_*,_std::default_delete<SuperCardPro>_>)
         in_RDI.super___uniq_ptr_impl<SuperCardPro,_std::default_delete<SuperCardPro>_>._M_t.
         super__Tuple_impl<0UL,_SuperCardPro_*,_std::default_delete<SuperCardPro>_>.
         super__Head_base<0UL,_SuperCardPro_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SuperCardPro> SuperCardPro::Open()
{
    std::unique_ptr<SuperCardPro> p;

#ifdef HAVE_FTD2XX
    if (!p)
        p = SuperCardProFTD2XX::Open();
#endif
#ifdef HAVE_FTDI
    if (!p)
        p = SuperCardProFTDI::Open();
#endif
    if (!p)
        p = SuperCardProUSB::Open();
#ifdef _WIN32
    if (!p)
        p = SuperCardProWin32::Open();
#endif

    return p;
}